

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O3

void __thiscall cppjieba::HMMModel::HMMModel(HMMModel *this,string *modelPath)

{
  EmitProbMap *pEVar1;
  vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  *this_00;
  pointer *pppuVar2;
  iterator iVar3;
  EmitProbMap *local_48;
  EmitProbMap *local_40;
  string *local_38;
  
  (this->emitProbB)._M_h._M_buckets = &(this->emitProbB)._M_h._M_single_bucket;
  (this->emitProbB)._M_h._M_bucket_count = 1;
  (this->emitProbB)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitProbB)._M_h._M_element_count = 0;
  (this->emitProbB)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->emitProbB)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitProbB)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->emitProbE)._M_h._M_buckets = &(this->emitProbE)._M_h._M_single_bucket;
  (this->emitProbE)._M_h._M_bucket_count = 1;
  (this->emitProbE)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitProbE)._M_h._M_element_count = 0;
  (this->emitProbE)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->emitProbE)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitProbE)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->emitProbM)._M_h._M_buckets = &(this->emitProbM)._M_h._M_single_bucket;
  (this->emitProbM)._M_h._M_bucket_count = 1;
  (this->emitProbM)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitProbM)._M_h._M_element_count = 0;
  (this->emitProbM)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->emitProbM)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitProbM)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pEVar1 = &this->emitProbS;
  (this->emitProbS)._M_h._M_buckets = &(this->emitProbS)._M_h._M_single_bucket;
  (this->emitProbS)._M_h._M_bucket_count = 1;
  (this->emitProbS)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitProbS)._M_h._M_element_count = 0;
  (this->emitProbS)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this_00 = &this->emitProbVec;
  local_38 = modelPath;
  memset(this->startProb,0,0xa0);
  (this->emitProbS)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitProbS)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builtin_strncpy(this->statMap,"BEMS",4);
  local_48 = &this->emitProbB;
  local_40 = &this->emitProbB;
  std::
  vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
  ::
  _M_realloc_insert<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>
            ((vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
              *)this_00,(iterator)0x0,&local_48);
  iVar3._M_current =
       (this->emitProbVec).
       super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->emitProbVec).
      super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_48 = &this->emitProbE;
    std::
    vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
    ::
    _M_realloc_insert<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>
              ((vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
                *)this_00,iVar3,&local_48);
    iVar3._M_current =
         (this->emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = &this->emitProbE;
    iVar3._M_current =
         (this->emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->emitProbVec).
    super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current ==
      (this->emitProbVec).
      super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_48 = &this->emitProbM;
    std::
    vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
    ::
    _M_realloc_insert<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>
              ((vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
                *)this_00,iVar3,&local_48);
    iVar3._M_current =
         (this->emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = &this->emitProbM;
    iVar3._M_current =
         (this->emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->emitProbVec).
    super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_48 = pEVar1;
  if (iVar3._M_current ==
      (this->emitProbVec).
      super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
    ::
    _M_realloc_insert<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>
              ((vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
                *)this_00,iVar3,&local_48);
  }
  else {
    *iVar3._M_current = pEVar1;
    pppuVar2 = &(this->emitProbVec).
                super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppuVar2 = *pppuVar2 + 1;
  }
  LoadModel(this,local_38);
  return;
}

Assistant:

HMMModel(const string& modelPath) {
    memset(startProb, 0, sizeof(startProb));
    memset(transProb, 0, sizeof(transProb));
    statMap[0] = 'B';
    statMap[1] = 'E';
    statMap[2] = 'M';
    statMap[3] = 'S';
    emitProbVec.push_back(&emitProbB);
    emitProbVec.push_back(&emitProbE);
    emitProbVec.push_back(&emitProbM);
    emitProbVec.push_back(&emitProbS);
    LoadModel(modelPath);
  }